

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::log_internal::anon_unknown_0::GlobalLogSinkSet::AddLogSink
          (GlobalLogSinkSet *this,LogSink *sink)

{
  undefined8 uVar1;
  __normal_iterator<absl::lts_20250127::LogSink_**,_std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
  _Var2;
  char *absl_raw_log_internal_filename;
  GlobalLogSinkSet *local_28;
  int local_20 [2];
  char *local_18;
  
  local_28 = this;
  Mutex::Lock((Mutex *)&GlobalSinks::global_sinks);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<absl::lts_20250127::LogSink**,std::vector<absl::lts_20250127::LogSink*,std::allocator<absl::lts_20250127::LogSink*>>>,__gnu_cxx::__ops::_Iter_equals_val<absl::lts_20250127::LogSink*const>>
                    (GlobalSinks::global_sinks.impl_.space_._8_8_,
                     GlobalSinks::global_sinks.impl_.space_._16_8_,&local_28);
  uVar1 = GlobalSinks::global_sinks.impl_.space_._16_8_;
  if (_Var2._M_current == (LogSink **)GlobalSinks::global_sinks.impl_.space_._16_8_) {
    if (_Var2._M_current == (LogSink **)GlobalSinks::global_sinks.impl_.space_._24_8_) {
      std::vector<absl::lts_20250127::LogSink*,std::allocator<absl::lts_20250127::LogSink*>>::
      _M_realloc_insert<absl::lts_20250127::LogSink*const&>
                ((vector<absl::lts_20250127::LogSink*,std::allocator<absl::lts_20250127::LogSink*>>
                  *)(GlobalSinks::global_sinks.impl_.space_ + 8),
                 (iterator)GlobalSinks::global_sinks.impl_.space_._16_8_,(LogSink **)&local_28);
    }
    else {
      *(GlobalLogSinkSet **)GlobalSinks::global_sinks.impl_.space_._16_8_ = local_28;
      GlobalSinks::global_sinks.impl_.space_._16_8_ =
           GlobalSinks::global_sinks.impl_.space_._16_8_ + 8;
    }
  }
  Mutex::Unlock((Mutex *)&GlobalSinks::global_sinks);
  if (_Var2._M_current == (LogSink **)uVar1) {
    return;
  }
  local_18 = 
  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/log/internal/log_sink_set.cc"
  ;
  local_20[1] = 3;
  local_20[0] = 0xd7;
  base_internal::
  AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
  operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
              *)&raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_20 + 1),
             &local_18,local_20,(char (*) [38])"Duplicate log sinks are not supported");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/log/internal/log_sink_set.cc"
                ,0xd7,
                "void absl::log_internal::(anonymous namespace)::GlobalLogSinkSet::AddLogSink(absl::LogSink *)"
               );
}

Assistant:

ABSL_LOCKS_EXCLUDED(guard_) {
    {
      absl::WriterMutexLock global_sinks_lock(&guard_);
      auto pos = std::find(sinks_.begin(), sinks_.end(), sink);
      if (pos == sinks_.end()) {
        sinks_.push_back(sink);
        return;
      }
    }
    ABSL_INTERNAL_LOG(FATAL, "Duplicate log sinks are not supported");
  }